

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_neg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int opsize_00;
  TCGv_i32 pTVar1;
  TCGv_i32 ea_result;
  int opsize;
  TCGv_i32 addr;
  TCGv_i32 dest;
  TCGv_i32 src1;
  TCGContext_conflict2 *tcg_ctx;
  DisasContext_conflict2 *pDStack_18;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  src1 = (TCGv_i32)s->uc->tcg_ctx;
  tcg_ctx._6_2_ = insn;
  pDStack_18 = s;
  s_local = (DisasContext_conflict2 *)env;
  opsize_00 = insn_opsize((uint)insn);
  dest = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,opsize_00,
                *(TCGv_i32 *)(src1 + 0x94f8),(TCGv_i32 *)&stack0xffffffffffffffc0,EA_LOADS,
                (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (dest == *(TCGv_i32 *)(src1 + 0x94f8)) {
    gen_addr_fault(pDStack_18);
  }
  else {
    addr = tcg_temp_new_i32((TCGContext_conflict2 *)src1);
    tcg_gen_neg_i32((TCGContext_conflict2 *)src1,addr,dest);
    set_cc_op(pDStack_18,opsize_00 + CC_OP_SUBB);
    gen_update_cc_add((TCGContext_conflict2 *)src1,addr,dest,opsize_00);
    tcg_gen_setcondi_i32_m68k((TCGContext_conflict2 *)src1,TCG_COND_NE,QREG_CC_X,addr,0);
    pTVar1 = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,opsize_00,addr,
                    (TCGv_i32 *)&stack0xffffffffffffffc0,EA_STORE,
                    (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    if (pTVar1 == *(TCGv_i32 *)(src1 + 0x94f8)) {
      gen_addr_fault(pDStack_18);
    }
    else {
      tcg_temp_free_i32((TCGContext_conflict2 *)src1,addr);
    }
  }
  return;
}

Assistant:

DISAS_INSN(neg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src1;
    TCGv dest;
    TCGv addr;
    int opsize;

    opsize = insn_opsize(insn);
    SRC_EA(env, src1, opsize, 1, &addr);
    dest = tcg_temp_new(tcg_ctx);
    tcg_gen_neg_i32(tcg_ctx, dest, src1);
    set_cc_op(s, CC_OP_SUBB + opsize);
    gen_update_cc_add(tcg_ctx, dest, src1, opsize);
    tcg_gen_setcondi_i32(tcg_ctx, TCG_COND_NE, QREG_CC_X, dest, 0);
    DEST_EA(env, insn, opsize, dest, &addr);
    tcg_temp_free(tcg_ctx, dest);
}